

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O3

void pmpaddr_csr_write_riscv64(CPURISCVState_conflict2 *env,uint32_t addr_index,target_ulong val)

{
  if (addr_index < 0x10) {
    if ((-1 < (char)(env->pmp_state).pmp[addr_index].cfg_reg) &&
       ((addr_index == 0xf || (((env->pmp_state).pmp[(ulong)addr_index + 1].cfg_reg & 0x98) != 0x88)
        ))) {
      (env->pmp_state).pmp[addr_index].addr_reg = val;
      pmp_update_rule(env,addr_index);
      return;
    }
  }
  return;
}

Assistant:

void pmpaddr_csr_write(CPURISCVState *env, uint32_t addr_index,
    target_ulong val)
{
    if (addr_index < MAX_RISCV_PMPS) {
        if (!pmp_is_locked(env, addr_index)) {
            env->pmp_state.pmp[addr_index].addr_reg = val;
            pmp_update_rule(env, addr_index);
        } else {
            qemu_log_mask(LOG_GUEST_ERROR,
                          "ignoring pmpaddr write - locked\n");
        }
    } else {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpaddr write - out of bounds\n");
    }
}